

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

int consume_trailer(archive_read_filter *self)

{
  int iVar1;
  long local_30;
  ssize_t avail;
  uchar *p;
  private_data_conflict1 *state;
  archive_read_filter *self_local;
  
  p = (uchar *)self->data;
  *(undefined1 *)&((z_streamp)((long)p + 0x70))->next_in = 0;
  state = (private_data_conflict1 *)self;
  iVar1 = cm_zlib_inflateEnd((z_streamp)p);
  if (iVar1 == 0) {
    avail = (ssize_t)__archive_read_filter_ahead
                               ((archive_read_filter *)(state->stream).total_in,8,&local_30);
    if (((void *)avail == (void *)0x0) || (local_30 == 0)) {
      self_local._4_4_ = -0x1e;
    }
    else {
      __archive_read_filter_consume((archive_read_filter *)(state->stream).total_in,8);
      self_local._4_4_ = 0;
    }
  }
  else {
    archive_set_error((archive *)(state->stream).next_out,-1,"Failed to clean up gzip decompressor")
    ;
    self_local._4_4_ = -0x1e;
  }
  return self_local._4_4_;
}

Assistant:

static int
consume_trailer(struct archive_read_filter *self)
{
	struct private_data *state;
	const unsigned char *p;
	ssize_t avail;

	state = (struct private_data *)self->data;

	state->in_stream = 0;
	switch (inflateEnd(&(state->stream))) {
	case Z_OK:
		break;
	default:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Failed to clean up gzip decompressor");
		return (ARCHIVE_FATAL);
	}

	/* GZip trailer is a fixed 8 byte structure. */
	p = __archive_read_filter_ahead(self->upstream, 8, &avail);
	if (p == NULL || avail == 0)
		return (ARCHIVE_FATAL);

	/* XXX TODO: Verify the length and CRC. */

	/* We've verified the trailer, so consume it now. */
	__archive_read_filter_consume(self->upstream, 8);

	return (ARCHIVE_OK);
}